

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_i2d_fp.cc
# Opt level: O0

int ASN1_item_i2d_bio(ASN1_ITEM *it,BIO *out,void *x)

{
  int iVar1;
  int ret;
  int n;
  uchar *b;
  void *x_local;
  BIO *out_local;
  ASN1_ITEM *it_local;
  
  _ret = (uchar *)0x0;
  b = (uchar *)x;
  x_local = out;
  out_local = (BIO *)it;
  iVar1 = ASN1_item_i2d((ASN1_VALUE *)x,(uchar **)&ret,it);
  if (_ret == (uchar *)0x0) {
    it_local._4_4_ = 0;
  }
  else {
    iVar1 = BIO_write_all((BIO *)x_local,_ret,(long)iVar1);
    OPENSSL_free(_ret);
    it_local._4_4_ = iVar1;
  }
  return it_local._4_4_;
}

Assistant:

int ASN1_item_i2d_bio(const ASN1_ITEM *it, BIO *out, void *x) {
  unsigned char *b = NULL;
  int n = ASN1_item_i2d(reinterpret_cast<ASN1_VALUE *>(x), &b, it);
  if (b == NULL) {
    return 0;
  }

  int ret = BIO_write_all(out, b, n);
  OPENSSL_free(b);
  return ret;
}